

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten.cpp
# Opt level: O0

int __thiscall ncnn::Flatten::forward(Flatten *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long *in_RDX;
  long *in_RSI;
  bool bVar1;
  uchar *outptr;
  uchar *ptr;
  int q;
  int size;
  size_t elemsize;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  Allocator *in_stack_fffffffffffffe48;
  size_t in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  Mat *in_stack_fffffffffffffe60;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined4 local_160;
  long local_158;
  undefined4 local_150;
  undefined4 local_14c;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_140;
  undefined8 local_138;
  void *local_130;
  int local_128;
  int local_124;
  long local_120;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  long *local_100;
  long *local_f8;
  int local_e4;
  long *local_e0;
  undefined1 local_d5;
  int local_d4;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b0;
  long *local_a0;
  long *local_98;
  long local_90;
  undefined4 local_84;
  long local_80;
  void *local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  undefined4 local_54;
  long local_50;
  undefined8 *local_30;
  
  local_10c = *(int *)((long)in_RSI + 0x2c);
  local_110 = (int)in_RSI[6];
  local_114 = *(int *)((long)in_RSI + 0x34);
  local_118 = (int)in_RSI[7];
  local_120 = in_RSI[2];
  local_124 = local_10c * local_110 * local_114;
  local_100 = in_RDX;
  local_f8 = in_RSI;
  Mat::create(in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
              in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  local_e0 = local_100;
  bVar1 = true;
  if (*local_100 != 0) {
    local_98 = local_100;
    bVar1 = local_100[8] * (long)(int)local_100[7] == 0;
  }
  if (bVar1) {
    local_e4 = -100;
  }
  else {
    for (local_128 = 0; local_128 < local_118; local_128 = local_128 + 1) {
      local_c8 = &local_178;
      local_64 = *(int *)((long)local_f8 + 0x2c);
      local_68 = (int)local_f8[6];
      local_6c = *(undefined4 *)((long)local_f8 + 0x34);
      local_130 = (void *)(*local_f8 + local_f8[8] * (long)local_128 * local_f8[2]);
      local_80 = local_f8[2];
      local_84 = (undefined4)local_f8[3];
      local_90 = local_f8[4];
      local_60 = &local_178;
      local_50 = (long)local_64 * (long)local_68 * local_80;
      local_c0 = &local_178;
      local_b0 = &local_178;
      local_54 = 0x10;
      local_d4 = local_128;
      local_d5 = 1;
      local_178 = 0;
      local_168 = 0;
      local_160 = 0;
      local_150 = 0;
      local_14c = 0;
      local_148 = 0;
      local_144 = 0;
      local_140 = 0;
      local_138 = 0;
      local_170 = 0;
      local_a0 = local_100;
      local_78 = local_130;
      local_30 = local_b0;
      local_158 = local_90;
      memcpy((void *)(*local_100 + local_124 * local_120 * (long)local_128),local_130,
             local_124 * local_120);
    }
    local_e4 = 0;
  }
  return local_e4;
}

Assistant:

int Flatten::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h * d;

    top_blob.create(size * channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const unsigned char* ptr = bottom_blob.channel(q);
        unsigned char* outptr = (unsigned char*)top_blob + size * elemsize * q;

        memcpy(outptr, ptr, size * elemsize);
    }

    return 0;
}